

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

void Node_RemoveData(node *Node,dataid Id,datatype Type)

{
  nodedata *pnVar1;
  nodedata *i;
  
  if (Node == (node *)0x0) {
    __assert_fail("(const void*)(Node)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x1f8,"void Node_RemoveData(node *, dataid, datatype)");
  }
  pnVar1 = (nodedata *)&Node->Data;
  do {
    i = pnVar1;
    pnVar1 = i->Next;
    if (pnVar1 == (nodedata *)0x0) {
      return;
    }
  } while (pnVar1->Code != (Id << 8 | Type));
  DataFree(*Node->VMT,Node,&i->Next,0);
  return;
}

Assistant:

NOINLINE void Node_RemoveData(node* Node, dataid Id, datatype Type)
{
    uint_fast32_t Code = (Id<<DYNDATA_SHIFT)|Type;
    nodedata** i;
    nodecontext* p = Node_Context(Node);

    for (i=&Node->Data;*i;i=&(*i)->Next)
        if ((*i)->Code == Code)
        {
            DataFree(p,Node,i,0);
            break;
        }
}